

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::basic_cbor_cursor<jsoncons::bytes_source,std::allocator<char>>::
basic_cbor_cursor<std::vector<unsigned_char,std::allocator<unsigned_char>>&>(void *param_1)

{
  uint uVar1;
  undefined8 in_R8;
  allocator<char> *in_stack_00000018;
  cbor_decode_options *in_stack_00000020;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000028;
  basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *in_stack_00000030;
  allocator<char> *in_stack_00000060;
  basic_json_visitor<char> *in_stack_00000068;
  basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_> *in_stack_00000070;
  
  ser_context::ser_context((ser_context *)((long)param_1 + 0x238));
  basic_staj_cursor<char>::basic_staj_cursor((basic_staj_cursor<char> *)param_1);
  (((basic_staj_visitor<char> *)param_1)->super_basic_json_visitor<char>)._vptr_basic_json_visitor =
       (_func_int **)(vtable + 0x18);
  ((basic_staj_visitor<char> *)((long)param_1 + 0x1e0))->index_ = (size_t)(vtable + 0xb8);
  basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::
  basic_cbor_parser<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
            (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018);
  basic_staj_visitor<char>::basic_staj_visitor((basic_staj_visitor<char> *)param_1);
  basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::
  basic_item_event_visitor_to_json_visitor(in_stack_00000070,in_stack_00000068,in_stack_00000060);
  *(undefined1 *)&(((basic_staj_visitor<char> *)((long)param_1 + 0x1e0))->shape_).size_ = 0;
  basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::cursor_mode
            ((basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *)
             &((basic_staj_visitor<char> *)param_1)->event_,true);
  uVar1 = (*(((basic_staj_visitor<char> *)param_1)->super_basic_json_visitor<char>).
            _vptr_basic_json_visitor[3])();
  if ((uVar1 & 1) == 0) {
    (*(((basic_staj_visitor<char> *)param_1)->super_basic_json_visitor<char>).
      _vptr_basic_json_visitor[8])(param_1,in_R8);
  }
  return;
}

Assistant:

basic_cbor_cursor(std::allocator_arg_t, const Allocator& alloc, 
        Sourceable&& source,
        const cbor_decode_options& options,
        std::error_code& ec)
       : parser_(std::forward<Sourceable>(source), options, alloc), 
         cursor_handler_adaptor_(cursor_visitor_, alloc),
         eof_(false)
    {
        parser_.cursor_mode(true);
        if (!done())
        {
            next(ec);
        }
    }